

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

LPCWSTR __thiscall Js::RecyclableKeyValueDisplay::Value(RecyclableKeyValueDisplay *this,int radix)

{
  char16 cVar1;
  StringBuilder<Memory::ArenaAllocator> *this_00;
  char16 *pcVar2;
  char16 *pcVar3;
  ResolvedObject local_e0;
  undefined1 local_a0 [8];
  RecyclableObjectDisplay keyDisplay;
  RecyclableObjectDisplay valueDisplay;
  
  local_e0.propId = -1;
  local_e0.isConst = false;
  local_e0.address = (IDiagObjectAddress *)0x0;
  local_e0.objectDisplay = (IDiagObjectModelDisplay *)0x0;
  local_e0.originalObj = (Var)0x0;
  local_e0.name = (LPCWSTR)0x0;
  local_e0.scriptContext = this->scriptContext;
  local_e0.obj = this->key;
  RecyclableObjectDisplay::RecyclableObjectDisplay((RecyclableObjectDisplay *)local_a0,&local_e0,0);
  local_e0.obj = this->value;
  RecyclableObjectDisplay::RecyclableObjectDisplay
            ((RecyclableObjectDisplay *)&keyDisplay.defaultAttributes,&local_e0,0);
  pcVar2 = RecyclableObjectDisplay::Value((RecyclableObjectDisplay *)local_a0,radix);
  pcVar3 = RecyclableObjectDisplay::Value
                     ((RecyclableObjectDisplay *)&keyDisplay.defaultAttributes,radix);
  this_00 = this->scriptContext->threadContext->debugManager->pCurrentInterpreterLocation->
            stringBuilder;
  this_00->length = 0;
  this_00->count = 0;
  this_00->lastChunk = (Data *)0x0;
  this_00->firstChunk = (Data *)0x0;
  this_00->secondChunk = (Data *)0x0;
  StringBuilder<Memory::ArenaAllocator>::Append(this_00,L'[');
  cVar1 = *pcVar2;
  while (cVar1 != L'\0') {
    pcVar2 = pcVar2 + 1;
    StringBuilder<Memory::ArenaAllocator>::Append(this_00,cVar1);
    cVar1 = *pcVar2;
  }
  StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<3ul>(this_00,(char16 (*) [3])0x10217e8);
  cVar1 = *pcVar3;
  while (cVar1 != L'\0') {
    pcVar3 = pcVar3 + 1;
    StringBuilder<Memory::ArenaAllocator>::Append(this_00,cVar1);
    cVar1 = *pcVar3;
  }
  StringBuilder<Memory::ArenaAllocator>::Append(this_00,L']');
  pcVar2 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
  return pcVar2;
}

Assistant:

LPCWSTR RecyclableKeyValueDisplay::Value(int radix)
    {
        ResolvedObject ro;
        ro.scriptContext = scriptContext;

        ro.obj = key;
        RecyclableObjectDisplay keyDisplay(&ro);

        ro.obj = value;
        RecyclableObjectDisplay valueDisplay(&ro);

        // Note, RecyclableObjectDisplay::Value(int) uses the shared string builder
        // so we cannot call it while building our string below.  Call both before hand.
        const char16* keyValue = keyDisplay.Value(radix);
        const char16* valueValue = valueDisplay.Value(radix);

        StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
        builder->Reset();

        builder->Append('[');
        builder->AppendSz(keyValue);
        builder->AppendCppLiteral(_u(", "));
        builder->AppendSz(valueValue);
        builder->Append(']');

        return builder->Detach();
    }